

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ExtractSubrangeInternal
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,uint start,uint num,long elements)

{
  LogMessage *pLVar1;
  string *psVar2;
  Type *pTVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  LogFinisher local_81;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  LogMessage local_68;
  
  uVar4 = (ulong)num;
  uVar6 = (ulong)start;
  if ((int)start < 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x8b7);
    pLVar1 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (start) >= (0): ");
    internal::LogFinisher::operator=(&local_81,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if ((int)num < 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x8b8);
    pLVar1 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (num) >= (0): ");
    internal::LogFinisher::operator=(&local_81,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if ((this->super_RepeatedPtrFieldBase).current_size_ < (int)(num + start)) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "src/../third_party/protobuf-lite/google/protobuf/repeated_field.h",0x8b9);
    pLVar1 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (start + num) <= (size()): ")
    ;
    internal::LogFinisher::operator=(&local_81,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (0 < (int)num) {
    local_80 = uVar6;
    local_78 = uVar4;
    if (elements != 0) {
      if ((this->super_RepeatedPtrFieldBase).arena_ == (Arena *)0x0) {
        uVar6 = 0;
        do {
          pTVar3 = internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this->super_RepeatedPtrFieldBase,start + (int)uVar6);
          *(Type **)(elements + uVar6 * 8) = pTVar3;
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
      else {
        uVar5 = 0;
        local_70 = uVar6;
        do {
          internal::RepeatedPtrFieldBase::
          Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                    (&this->super_RepeatedPtrFieldBase,(int)local_70 + (int)uVar5);
          psVar2 = (string *)operator_new(0x20);
          *(string **)psVar2 = psVar2 + 0x10;
          *(undefined8 *)(psVar2 + 8) = 0;
          psVar2[0x10] = (string)0x0;
          std::__cxx11::string::_M_assign(psVar2);
          *(string **)(elements + uVar5 * 8) = psVar2;
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
    }
    internal::RepeatedPtrFieldBase::CloseGap
              (&this->super_RepeatedPtrFieldBase,(int)local_80,(int)local_78);
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::ExtractSubrangeInternal(
    int start, int num, Element** elements, std::true_type) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, size());

  if (num > 0) {
    // Save the values of the removed elements if requested.
    if (elements != NULL) {
      if (GetArena() != NULL) {
        // If we're on an arena, we perform a copy for each element so that the
        // returned elements are heap-allocated.
        for (int i = 0; i < num; ++i) {
          Element* element =
              RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
          typename TypeHandler::Type* new_value =
              TypeHandler::NewFromPrototype(element, NULL);
          TypeHandler::Merge(*element, new_value);
          elements[i] = new_value;
        }
      } else {
        for (int i = 0; i < num; ++i) {
          elements[i] = RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
        }
      }
    }
    CloseGap(start, num);
  }
}